

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Drop * __thiscall wasm::Builder::makeDrop(Builder *this,Expression *value)

{
  Drop *this_00;
  Drop *ret;
  Expression *value_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::Drop>(&this->wasm->allocator);
  this_00->value = value;
  Drop::finalize(this_00);
  return this_00;
}

Assistant:

Drop* makeDrop(Expression* value) {
    auto* ret = wasm.allocator.alloc<Drop>();
    ret->value = value;
    ret->finalize();
    return ret;
  }